

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.cpp
# Opt level: O1

void __thiscall Amiga::Blitter<true>::set_control(Blitter<true> *this,int index,uint16_t value)

{
  byte bVar1;
  
  if (index == 0) {
    this->minterms_ = (byte)value;
    (this->sequencer_).control_ = (byte)(value >> 8) & 0xf;
    (this->sequencer_).index_ = 0;
  }
  else {
    this->line_mode_ = (bool)((byte)value & 1);
    bVar1 = (byte)(value >> 1);
    this->one_dot_ = (bool)(bVar1 & 1);
    this->line_direction_ = value >> 2 & 7;
    this->line_sign_ = -(uint)((value >> 6 & 1) != 0) | 1;
    this->direction_ = -((bVar1 & 0x7f) & 1) | 1;
    this->exclusive_fill_ = (bool)((byte)(value >> 4) & 1);
    this->inclusive_fill_ = (value & 0x18) == 8;
    this->fill_carry_ = (bool)((byte)(value >> 2) & 1);
  }
  this->shifts_[index] = (uint)(value >> 0xc);
  return;
}

Assistant:

void Blitter<record_bus>::set_control(int index, uint16_t value) {
	if(index) {
		line_mode_ = (value & 0x0001);
		one_dot_ = value & 0x0002;
		line_direction_ = (value >> 2) & 7;
		line_sign_ = (value & 0x0040) ? -1 : 1;

		direction_ = one_dot_ ? uint32_t(-1) : uint32_t(1);
		exclusive_fill_ = (value & 0x0010);
		inclusive_fill_ = !exclusive_fill_ && (value & 0x0008);	// Exclusive fill takes precedence. Probably? TODO: verify.
		fill_carry_ = (value & 0x0004);
	} else {
		minterms_ = value & 0xff;
		sequencer_.set_control(value >> 8);
	}
	shifts_[index] = value >> 12;
	logger.info().append("Set control %d to %04x", index, value);
}